

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

uint * Corrade::Containers::Implementation::
       arrayGrowBy<unsigned_int,Corrade::Containers::ArrayMallocAllocator<unsigned_int>>
                 (Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *array,size_t count)

{
  uint *it;
  uint *local_40;
  uint *newArray;
  size_t capacity;
  size_t desiredCapacity;
  ArrayGuts<unsigned_int> *arrayGuts;
  size_t count_local;
  Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *array_local;
  
  if (count == 0) {
    array_local = (Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)
                  (array->_data + array->_size);
  }
  else {
    capacity = array->_size + count;
    desiredCapacity = (size_t)array;
    arrayGuts = (ArrayGuts<unsigned_int> *)count;
    count_local = (size_t)array;
    if (array->_deleter == ArrayMallocAllocator<unsigned_int>::deleter) {
      newArray = (uint *)ArrayMallocAllocator<unsigned_int>::capacity(array->_data);
      if (newArray < (uint *)((long)&arrayGuts->data + *(long *)(desiredCapacity + 8))) {
        newArray = (uint *)ArrayMallocAllocator<unsigned_int>::grow
                                     (*(uint **)desiredCapacity,capacity);
        ArrayMallocAllocator<unsigned_int>::reallocate
                  ((uint **)desiredCapacity,*(size_t *)(desiredCapacity + 8),(size_t)newArray);
      }
    }
    else {
      newArray = (uint *)ArrayMallocAllocator<unsigned_int>::grow((uint *)0x0,capacity);
      local_40 = ArrayMallocAllocator<unsigned_int>::allocate((size_t)newArray);
      arrayMoveConstruct<unsigned_int,_0>
                (*(uint **)desiredCapacity,local_40,*(size_t *)(desiredCapacity + 8));
      Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::Array
                ((Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)&it,local_40,
                 *(size_t *)(desiredCapacity + 8),ArrayMallocAllocator<unsigned_int>::deleter);
      Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::operator=
                ((Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)count_local,
                 (Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)&it);
      Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)>::~Array
                ((Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)&it);
    }
    array_local = (Array<unsigned_int,_void_(*)(unsigned_int_*,_unsigned_long)> *)
                  (*(long *)desiredCapacity + *(long *)(desiredCapacity + 8) * 4);
    *(long *)(desiredCapacity + 8) = (long)&arrayGuts->data + *(long *)(desiredCapacity + 8);
  }
  return (uint *)array_local;
}

Assistant:

T* arrayGrowBy(Array<T>& array, const std::size_t count) {
    /* Direct access & caching to speed up debug builds */
    auto& arrayGuts = reinterpret_cast<Implementation::ArrayGuts<T>&>(array);

    /* No values to add, early exit */
    if(!count)
        return arrayGuts.data + arrayGuts.size;

    /* For arrays with an unknown deleter we'll always copy-allocate to a new
       place. Not using reallocate() as we don't know where the original memory
       comes from. */
    const std::size_t desiredCapacity = arrayGuts.size + count;
    std::size_t capacity;
    #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
    T* oldMid = nullptr;
    #endif
    if(arrayGuts.deleter != Allocator::deleter) {
        capacity = Allocator::grow(nullptr, desiredCapacity);
        T* const newArray = Allocator::allocate(capacity);
        arrayMoveConstruct<T>(arrayGuts.data, newArray, arrayGuts.size);
        array = Array<T>{newArray, arrayGuts.size, Allocator::deleter};

    /* Otherwise, if there's no space anymore, reallocate, which might be able
       to grow in-place */
    } else {
        capacity = Allocator::capacity(arrayGuts.data);
        if(arrayGuts.size + count > capacity) {
            capacity = Allocator::grow(arrayGuts.data, desiredCapacity);
            Allocator::reallocate(arrayGuts.data, arrayGuts.size, capacity);
        } else {
            #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
            oldMid = arrayGuts.data + arrayGuts.size;
            #endif
        }
    }

    /* Increase array size and return the previous end pointer */
    T* const it = arrayGuts.data + arrayGuts.size;
    #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
    __sanitizer_annotate_contiguous_container(
        Allocator::base(arrayGuts.data),
        arrayGuts.data + capacity,
        /* For a new allocation, ASan assumes the previous middle pointer is at
           the end of the array. If we grew an existing allocation, the
           previous middle is set what __sanitier_acc() received as a middle
           value before */
        /** @todo with std::realloc possibly happening in reallocate(), is that
            really a new allocation? what should I do there? */
        oldMid ? oldMid : arrayGuts.data + capacity,
        arrayGuts.data + arrayGuts.size + count);
    #endif
    arrayGuts.size += count;
    return it;
}